

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O2

void __thiscall
CLIntercept::startAubCapture
          (CLIntercept *this,char *functionName,uint64_t enqueueCounter,cl_kernel kernel,
          cl_uint workDim,size_t *gws,size_t *lws,cl_command_queue command_queue)

{
  uint uVar1;
  uint uVar2;
  ostream *poVar3;
  double __x;
  ostringstream ss;
  char charBuf [256];
  string local_320;
  Services_Common *local_300;
  pthread_mutex_t *local_2f8;
  string local_2f0;
  string local_2d0 [32];
  string local_2b0 [11];
  char local_138 [264];
  
  if (this->m_AubCaptureStarted != false) {
    return;
  }
  local_2f8 = (pthread_mutex_t *)&this->m_Mutex;
  std::mutex::lock((mutex *)&local_2f8->__data);
  if (kernel != (cl_kernel)0x0) {
    if (this->m_AubCaptureKernelEnqueueSkipCounter <
        (this->m_Config).AubCaptureNumKernelEnqueuesSkip) {
      this->m_AubCaptureKernelEnqueueSkipCounter = this->m_AubCaptureKernelEnqueueSkipCounter + 1;
      goto LAB_0016e91e;
    }
    uVar2 = this->m_AubCaptureKernelEnqueueCaptureCounter;
    uVar1 = (this->m_Config).AubCaptureNumKernelEnqueuesCapture;
    this->m_AubCaptureKernelEnqueueCaptureCounter = uVar2 + 1;
    if (uVar1 <= uVar2) goto LAB_0016e91e;
  }
  if (this->m_AubCaptureStarted == false) {
    (*(this->m_Dispatch).clFinish)(command_queue);
    std::__cxx11::string::string((string *)&local_320,"",(allocator *)local_2b0);
    std::__cxx11::string::string((string *)local_2b0,sc_DumpDirectoryName,(allocator *)&local_2f0);
    local_300 = &(this->m_OS).super_Services_Common;
    OS::Services_Common::GetDumpDirectoryName(local_300,local_2b0,&local_320);
    std::__cxx11::string::~string((string *)local_2b0);
    std::__cxx11::string::append((char *)&local_320);
    std::__cxx11::string::append((char *)&local_320);
    if ((this->m_Config).AubCaptureIndividualEnqueues == true) {
      std::__cxx11::string::append((char *)&local_320);
      snprintf(local_138,0x100,"%08u",enqueueCounter & 0xffffffff);
      std::__cxx11::string::append((char *)&local_320);
      std::__cxx11::string::append((char *)&local_320);
      if (kernel == (cl_kernel)0x0) {
        std::__cxx11::string::append((char *)&local_320);
      }
      else {
        getShortKernelName_abi_cxx11_(&local_2f0,this,kernel);
        std::__cxx11::string::append((char *)&local_320);
        std::__cxx11::string::append((string *)&local_320);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2b0);
        std::operator<<((ostream *)local_2b0,"_G_");
        if (gws == (size_t *)0x0) {
          std::operator<<((ostream *)local_2b0,"NULL");
        }
        else if ((workDim != 0) &&
                (std::ostream::_M_insert<unsigned_long>((ulong)local_2b0), workDim != 1)) {
          poVar3 = std::operator<<((ostream *)local_2b0,"x");
          std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
          if (2 < workDim) {
            poVar3 = std::operator<<((ostream *)local_2b0,"x");
            std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
          }
        }
        std::operator<<((ostream *)local_2b0,"_L_");
        if (lws == (size_t *)0x0) {
          std::operator<<((ostream *)local_2b0,"NULL");
        }
        else if ((workDim != 0) &&
                (std::ostream::_M_insert<unsigned_long>((ulong)local_2b0), workDim != 1)) {
          poVar3 = std::operator<<((ostream *)local_2b0,"x");
          std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
          if (2 < workDim) {
            poVar3 = std::operator<<((ostream *)local_2b0,"x");
            std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
          }
        }
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::append((string *)&local_320);
        std::__cxx11::string::~string(local_2d0);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2b0);
        std::__cxx11::string::~string((string *)&local_2f0);
      }
    }
    else if (((this->m_Config).AubCaptureMinEnqueue != 0) ||
            ((this->m_Config).AubCaptureMaxEnqueue != 0xffffffff)) {
      std::__cxx11::string::append((char *)&local_320);
      snprintf(local_138,0x100,"%08u",(ulong)(this->m_Config).AubCaptureMinEnqueue);
      std::__cxx11::string::append((char *)&local_320);
      std::__cxx11::string::append((char *)&local_320);
      snprintf(local_138,0x100,"%08u",(ulong)(this->m_Config).AubCaptureMaxEnqueue);
      std::__cxx11::string::append((char *)&local_320);
    }
    OS::Services_Common::MakeDumpDirectories(local_300,&local_320);
    std::__cxx11::string::append((char *)&local_320);
    OS::Services::StartAubCapture
              ((Services *)local_300,&local_320,(ulong)(this->m_Config).AubCaptureStartWait);
    std::operator+(&local_2f0,"AubCapture started... maybe.  File name is: ",&local_320);
    std::operator+(local_2b0,&local_2f0,"\n");
    log(this,__x);
    std::__cxx11::string::~string((string *)local_2b0);
    std::__cxx11::string::~string((string *)&local_2f0);
    this->m_AubCaptureStarted = true;
    std::__cxx11::string::~string((string *)&local_320);
  }
LAB_0016e91e:
  pthread_mutex_unlock(local_2f8);
  return;
}

Assistant:

void CLIntercept::startAubCapture(
    const char* functionName,
    const uint64_t enqueueCounter,
    const cl_kernel kernel,
    const cl_uint workDim,
    const size_t* gws,
    const size_t* lws,
    cl_command_queue command_queue )
{
    if( m_AubCaptureStarted == false )
    {
        std::lock_guard<std::mutex> lock(m_Mutex);

        // For kernels, perform aub capture skip checks.  We'll skip aubcapture if:
        // - the current skip counter is less than the specified skip counter, or
        // - the current capture counter is greater than or equal to the specified capture counter.

        bool    skip = false;
        if( kernel != NULL )
        {
            if( m_AubCaptureKernelEnqueueSkipCounter < m_Config.AubCaptureNumKernelEnqueuesSkip )
            {
                //logf( "Skipping kernel aub capture: current skip counter is %u, requested skip counter is %u.\n",
                //    m_AubCaptureKernelEnqueueSkipCounter,
                //    m_Config.AubCaptureNumKernelEnqueuesSkip );

                skip = true;
                ++m_AubCaptureKernelEnqueueSkipCounter;
            }
            else
            {
                if( m_AubCaptureKernelEnqueueCaptureCounter >= m_Config.AubCaptureNumKernelEnqueuesCapture )
                {
                    //logf( "Skipping kernel aub capture: current capture counter is %u, requested capture counter is %u.\n",
                    //    m_AubCaptureKernelEnqueueCaptureCounter,
                    //    m_Config.AubCaptureNumKernelEnqueuesCapture );
                    skip = true;
                }

                ++m_AubCaptureKernelEnqueueCaptureCounter;
            }
        }

        if( skip == false &&
            m_AubCaptureStarted == false )
        {
            // Try to call clFinish() on the passed-in command queue.
            // This isn't perfect, since we'd really rather call
            // clFinish on all command queues to start with a fresh
            // capture, but it's better than nothing.
            // TODO: Is Flush() sufficient?
            dispatch().clFinish( command_queue );

            char    charBuf[ MAX_PATH ];

            std::string fileName = "";

            // Get the dump directory name.
            {
                OS().GetDumpDirectoryName( sc_DumpDirectoryName, fileName );
                fileName += "/";
                fileName += "AubCapture";

                if( m_Config.AubCaptureIndividualEnqueues )
                {
                    fileName += "_Enqueue_";

                    CLI_SPRINTF( charBuf, MAX_PATH, "%08u", (cl_uint)enqueueCounter );

                    fileName += charBuf;
                    fileName += "_";

                    if( kernel )
                    {
                        const std::string& kernelName = getShortKernelName(kernel);
                        fileName += "kernel_";
                        fileName += kernelName;

                        std::ostringstream  ss;
                        ss << "_G_";
                        if( gws )
                        {
                            if( workDim >= 1 )
                            {
                                ss << gws[0];
                            }
                            if( workDim >= 2 )
                            {
                                ss << "x" << gws[1];
                            }
                            if( workDim >= 3 )
                            {
                                ss << "x" << gws[2];
                            }
                        }
                        else
                        {
                            ss << "NULL";
                        }
                        ss << "_L_";
                        if( lws )
                        {
                            if( workDim >= 1 )
                            {
                                ss << lws[0];
                            }
                            if( workDim >= 2 )
                            {
                                ss << "x" << lws[1];
                            }
                            if( workDim >= 3 )
                            {
                                ss << "x" << lws[2];
                            }
                        }
                        else
                        {
                            ss << "NULL";
                        }
                        fileName += ss.str();
                    }
                    else
                    {
                        fileName += functionName;
                    }
                }
                else if( m_Config.AubCaptureMinEnqueue != 0 ||
                         m_Config.AubCaptureMaxEnqueue != UINT_MAX )
                {
                    fileName += "_Enqueue_";

                    CLI_SPRINTF( charBuf, MAX_PATH, "%08u", m_Config.AubCaptureMinEnqueue );

                    fileName += charBuf;
                    fileName += "_to_";

                    CLI_SPRINTF( charBuf, MAX_PATH, "%08u", m_Config.AubCaptureMaxEnqueue );

                    fileName += charBuf;
                }
            }

            // Now make directories as appropriate.
            {
                OS().MakeDumpDirectories( fileName );
            }

#if defined(_WIN32)
            if( m_Config.AubCaptureKDC )
            {
                fileName += ".daf";
                OS().StartAubCaptureKDC(
                    fileName,
                    config().AubCaptureStartWait );
            }
            else
#endif
            {
                fileName += ".aub";
                OS().StartAubCapture(
                    fileName,
                    config().AubCaptureStartWait );
            }
            log( "AubCapture started... maybe.  File name is: " + fileName + "\n" );

            // No matter what, set the flag that aubcapture is started, so we
            // don't try again.
            m_AubCaptureStarted = true;
        }
    }
}